

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

bool __thiscall
Fossilize::StreamArchive::decode_payload
          (StreamArchive *this,void *blob,size_t blob_size,Entry *entry,bool concurrent)

{
  uint32_t uVar1;
  bool bVar2;
  
  uVar1 = (entry->header).format;
  if (uVar1 == 2) {
    bVar2 = decode_payload_deflate(this,blob,blob_size,entry,concurrent);
    return bVar2;
  }
  if (uVar1 == 1) {
    bVar2 = decode_payload_uncompressed(this,blob,blob_size,entry,concurrent);
    return bVar2;
  }
  return false;
}

Assistant:

bool decode_payload(void *blob, size_t blob_size, const Entry &entry, bool concurrent)
	{
		if (entry.header.format == FOSSILIZE_COMPRESSION_NONE)
			return decode_payload_uncompressed(blob, blob_size, entry, concurrent);
		else if (entry.header.format == FOSSILIZE_COMPRESSION_DEFLATE)
			return decode_payload_deflate(blob, blob_size, entry, concurrent);
		else
			return false;
	}